

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_body(parser *p)

{
  undefined6 uVar1;
  equip_slot *peVar2;
  equip_slot *peVar3;
  equip_slot *local_38;
  equip_slot *s_old;
  equip_slot *s_temp;
  equip_slot *s_new;
  player_body *ppStack_18;
  wchar_t i;
  player_body *b;
  parser *p_local;
  
  bodies = (player_body *)parser_priv(p);
  z_info->equip_slots_max = 0;
  for (ppStack_18 = bodies; ppStack_18 != (player_body *)0x0; ppStack_18 = ppStack_18->next) {
    if (z_info->equip_slots_max < ppStack_18->count) {
      z_info->equip_slots_max = ppStack_18->count;
    }
  }
  ppStack_18 = bodies;
  do {
    if (ppStack_18 == (player_body *)0x0) {
      parser_destroy(p);
      return 0;
    }
    peVar2 = (equip_slot *)mem_zalloc((ulong)z_info->equip_slots_max << 5);
    if (ppStack_18->slots != (equip_slot *)0x0) {
      local_38 = ppStack_18->slots;
      for (s_new._4_4_ = 0; s_new._4_4_ < (int)(uint)z_info->equip_slots_max;
          s_new._4_4_ = s_new._4_4_ + 1) {
        peVar3 = peVar2 + s_new._4_4_;
        peVar3->next = local_38->next;
        uVar1 = *(undefined6 *)&local_38->field_0xa;
        peVar3->type = local_38->type;
        *(undefined6 *)&peVar3->field_0xa = uVar1;
        peVar3->name = local_38->name;
        peVar3->obj = local_38->obj;
        local_38 = local_38->next;
        if (local_38 == (equip_slot *)0x0) break;
      }
      for (s_new._4_4_ = 0; s_new._4_4_ < (int)(uint)z_info->equip_slots_max;
          s_new._4_4_ = s_new._4_4_ + 1) {
        if (peVar2[s_new._4_4_].next != (equip_slot *)0x0) {
          peVar2[s_new._4_4_].next = peVar2 + (s_new._4_4_ + 1);
        }
      }
      s_old = ppStack_18->slots;
      while (s_old != (equip_slot *)0x0) {
        peVar3 = s_old->next;
        mem_free(s_old);
        s_old = peVar3;
      }
    }
    ppStack_18->slots = peVar2;
    ppStack_18 = ppStack_18->next;
  } while( true );
}

Assistant:

static errr finish_parse_body(struct parser *p) {
	struct player_body *b;
	int i;
	bodies = parser_priv(p);

	/* Scan the list for the max slots */
	z_info->equip_slots_max = 0;
	for (b = bodies; b; b = b->next) {
		if (b->count > z_info->equip_slots_max)
			z_info->equip_slots_max = b->count;
	}

	/* Allocate the slot list and copy */
	for (b = bodies; b; b = b->next) {
		struct equip_slot *s_new;

		s_new = mem_zalloc(z_info->equip_slots_max * sizeof(*s_new));
		if (b->slots) {
			struct equip_slot *s_temp, *s_old = b->slots;

			/* Allocate space and copy */
			for (i = 0; i < z_info->equip_slots_max; i++) {
				memcpy(&s_new[i], s_old, sizeof(*s_old));
				s_old = s_old->next;
				if (!s_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->equip_slots_max; i++)
				if (s_new[i].next)
					s_new[i].next = &s_new[i + 1];

			/* Tidy up */
			s_old = b->slots;
			s_temp = s_old;
			while (s_temp) {
				s_temp = s_old->next;
				mem_free(s_old);
				s_old = s_temp;
			}
		}
		b->slots = s_new;
	}
	parser_destroy(p);
	return 0;
}